

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  protobuf *extraout_RDX;
  protobuf *ppVar8;
  uint64 extraout_RDX_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  protobuf *this;
  protobuf *this_00;
  bool bVar13;
  uint128 n;
  uint128 n_00;
  LogFinisher local_71;
  uint128 *local_70;
  LogMessage local_68;
  
  uVar10 = divisor.hi_;
  this_00 = (protobuf *)divisor.lo_;
  n.lo_ = dividend.hi_;
  this = (protobuf *)dividend.lo_;
  ppVar8 = this_00;
  if (this_00 == (protobuf *)0x0 && uVar10 == 0) {
    local_70 = remainder_ret;
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
               ,0x55);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"Division or mod by zero: dividend.hi=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,n.lo_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", lo=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(unsigned_long)this);
    internal::LogFinisher::operator=(&local_71,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
    ppVar8 = extraout_RDX;
    remainder_ret = local_70;
  }
  bVar13 = n.lo_ < uVar10;
  if (uVar10 == n.lo_) {
    bVar13 = this < this_00;
  }
  if (bVar13) {
    quotient_ret->lo_ = 0;
    quotient_ret->hi_ = 0;
    goto LAB_0057998f;
  }
  if (this_00 == this && uVar10 == n.lo_) {
    quotient_ret->lo_ = 1;
    quotient_ret->hi_ = 0;
    remainder_ret->lo_ = 0;
    remainder_ret->hi_ = 0;
    return;
  }
  n.hi_ = (uint64)ppVar8;
  local_70 = quotient_ret;
  iVar1 = Fls128(this,n);
  n_00.hi_ = extraout_RDX_00;
  n_00.lo_ = uVar10;
  iVar2 = Fls128(this_00,n_00);
  iVar7 = iVar1 - iVar2;
  bVar5 = (byte)iVar7;
  if (iVar7 < 0x40) {
    if (iVar1 != iVar2) {
      uVar10 = uVar10 << (bVar5 & 0x3f) | (ulong)this_00 >> 0x40 - (bVar5 & 0x3f);
      this_00 = (protobuf *)((long)this_00 << (bVar5 & 0x3f));
    }
  }
  else if (iVar7 < 0x80) {
    uVar10 = (long)this_00 << (bVar5 & 0x3f);
    this_00 = (protobuf *)0x0;
  }
  else {
    this_00 = (protobuf *)0x0;
    uVar10 = 0;
  }
  if (iVar7 < 0x40) {
    if (iVar1 == iVar2) {
      uVar4 = 1;
LAB_00579922:
      uVar11 = 0;
    }
    else {
      uVar11 = 1L >> (-bVar5 & 0x3f);
      uVar4 = 1L << (bVar5 & 0x3f);
    }
  }
  else {
    if (0x7f < iVar7) {
      uVar4 = 0;
      goto LAB_00579922;
    }
    uVar11 = 1L << (bVar5 & 0x3f);
    uVar4 = 0;
  }
  if (uVar11 == 0 && uVar4 == 0) {
    uVar9 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar9 = 0;
    do {
      bVar13 = uVar10 <= n.lo_;
      if (n.lo_ == uVar10) {
        bVar13 = this_00 <= this;
      }
      if (bVar13) {
        bVar13 = this < this_00;
        this = this + -(long)this_00;
        n.lo_ = (n.lo_ - uVar10) - (ulong)bVar13;
        uVar9 = uVar9 | uVar11;
        uVar6 = uVar6 | uVar4;
      }
      uVar4 = uVar4 >> 1 | uVar11 << 0x3f;
      this_00 = (protobuf *)((ulong)this_00 >> 1 | uVar10 << 0x3f);
      uVar12 = uVar11 >> 1;
      uVar10 = uVar10 >> 1;
      bVar13 = 1 < uVar11;
      uVar11 = uVar12;
    } while ((bVar13) || (uVar4 != 0));
  }
  local_70->lo_ = uVar6;
  local_70->hi_ = uVar9;
LAB_0057998f:
  remainder_ret->lo_ = (uint64)this;
  remainder_ret->hi_ = n.lo_;
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  }

  if (divisor > dividend) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  }

  if (divisor == dividend) {
    *quotient_ret = 1;
    *remainder_ret = 0;
    return;
  }

  uint128 denominator = divisor;
  uint128 position = 1;
  uint128 quotient = 0;

  // Left aligns the MSB of the denominator and the dividend.
  int shift = Fls128(dividend) - Fls128(denominator);
  denominator <<= shift;
  position <<= shift;

  // Uses shift-subtract algorithm to divide dividend by denominator. The
  // remainder will be left in dividend.
  while (position > 0) {
    if (dividend >= denominator) {
      dividend -= denominator;
      quotient |= position;
    }
    position >>= 1;
    denominator >>= 1;
  }

  *quotient_ret = quotient;
  *remainder_ret = dividend;
}